

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O1

void __thiscall
dg::vr::ValueRelations::RelatedValueIterator::RelatedValueIterator
          (RelatedValueIterator *this,ValueRelations *v,Handle start,Relations *allowedEdges)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  
  this->vr = v;
  RelationsGraph<dg::vr::ValueRelations>::getRelated
            (&this->related,&v->graph,start,allowedEdges,false);
  p_Var1 = (this->related)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  (this->bucketIt)._M_node = p_Var1;
  cVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&(this->vr->bucketToVals)._M_t,(key_type *)(p_Var1 + 1));
  (this->valueIt)._M_current = (Value **)cVar2._M_node[1]._M_parent;
  (this->current).first = (Value *)0x0;
  (this->current).second.bits.super__Base_bitset<1UL>._M_w = 0;
  this->isEnd = false;
  nextViableValue(this);
  return;
}

Assistant:

RelatedValueIterator(const ValueRelations &v, Handle start,
                             const Relations &allowedEdges)
                : vr(v), related(vr.graph.getRelated(start, allowedEdges)),
                  bucketIt(related.begin()),
                  valueIt(getCurrentEqual().begin()) {
            assert(allowedEdges.has(Relations::EQ) &&
                   "at least one related bucket");
            nextViableValue();
        }